

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O3

void __thiscall
duckdb::LocalSortState::SinkChunk(LocalSortState *this,DataChunk *sort,DataChunk *payload)

{
  value_type vVar1;
  value_type vVar2;
  data_ptr_t *key_locations;
  idx_t iVar3;
  idx_t prefix_len;
  SortLayout *pSVar4;
  RowLayout *layout;
  undefined8 uVar5;
  pointer col_data;
  const_reference cVar6;
  pointer pRVar7;
  SelectionVector *pSVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  const_reference pvVar12;
  type pRVar13;
  size_type sVar14;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> local_c8;
  undefined1 local_a8 [32];
  DataChunk blob_chunk;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> local_48;
  
  key_locations = (data_ptr_t *)(this->addresses).data;
  local_a8._24_8_ = payload;
  pRVar7 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
           ::operator->(&this->radix_sorting_data);
  iVar3 = sort->count;
  pSVar8 = FlatVector::IncrementalSelectionVector();
  RowDataCollection::Build
            ((vector<duckdb::BufferHandle,_true> *)&local_c8,pRVar7,iVar3,key_locations,(idx_t *)0x0
             ,pSVar8);
  if ((sort->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (sort->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar14 = 0;
    do {
      cVar6 = vector<bool,_true>::get<true>(&this->sort_layout->has_null,sVar14);
      pvVar9 = vector<duckdb::OrderByNullType,_true>::operator[]
                         (&this->sort_layout->order_by_null_types,sVar14);
      vVar1 = *pvVar9;
      pvVar10 = vector<duckdb::OrderType,_true>::operator[](&this->sort_layout->order_types,sVar14);
      vVar2 = *pvVar10;
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&sort->data,sVar14);
      iVar3 = sort->count;
      pSVar8 = this->sel_ptr;
      pvVar12 = vector<unsigned_long,_true>::operator[](&this->sort_layout->prefix_lengths,sVar14);
      prefix_len = *pvVar12;
      pvVar12 = vector<unsigned_long,_true>::operator[](&this->sort_layout->column_sizes,sVar14);
      RowOperations::RadixScatter
                (pvVar11,iVar3,pSVar8,iVar3,key_locations,vVar2 == DESCENDING,cVar6,
                 vVar1 == NULLS_FIRST,prefix_len,*pvVar12,0);
      sVar14 = sVar14 + 1;
    } while (sVar14 < (ulong)(((long)(sort->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(sort->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  if (this->sort_layout->all_constant == false) {
    DataChunk::DataChunk(&blob_chunk);
    blob_chunk.count = sort->count;
    if ((sort->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (sort->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar14 = 0;
      do {
        cVar6 = vector<bool,_true>::get<true>(&this->sort_layout->constant_size,sVar14);
        if (!cVar6) {
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&sort->data,sVar14);
          ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::
          emplace_back<duckdb::Vector&>
                    ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&blob_chunk,pvVar11);
        }
        sVar14 = sVar14 + 1;
      } while (sVar14 < (ulong)(((long)(sort->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(sort->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x4ec4ec4ec4ec4ec5));
    }
    pRVar7 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
             ::operator->(&this->blob_sorting_data);
    iVar3 = blob_chunk.count;
    pSVar8 = FlatVector::IncrementalSelectionVector();
    RowDataCollection::Build
              ((vector<duckdb::BufferHandle,_true> *)&local_48,pRVar7,iVar3,key_locations,
               (idx_t *)0x0,pSVar8);
    local_a8._16_8_ =
         local_c8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_a8._8_8_ =
         local_c8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_a8._0_8_ =
         local_c8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_c8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_c8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_start =
         local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_c8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
              ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)local_a8);
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_48);
    DataChunk::ToUnifiedFormat((DataChunk *)local_a8);
    uVar5 = local_a8._0_8_;
    pSVar4 = this->sort_layout;
    pRVar13 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator*(&this->blob_sorting_heap);
    RowOperations::Scatter
              (&blob_chunk,(UnifiedVectorFormat *)uVar5,&pSVar4->blob_layout,&this->addresses,
               pRVar13,this->sel_ptr,blob_chunk.count);
    if ((pointer)local_a8._0_8_ != (pointer)0x0) {
      ::std::default_delete<duckdb::UnifiedVectorFormat[]>::operator()
                ((default_delete<duckdb::UnifiedVectorFormat[]> *)local_a8,
                 (UnifiedVectorFormat *)local_a8._0_8_);
    }
    DataChunk::~DataChunk(&blob_chunk);
  }
  pRVar7 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
           ::operator->(&this->payload_data);
  uVar5 = local_a8._24_8_;
  iVar3 = *(idx_t *)(local_a8._24_8_ + 0x18);
  pSVar8 = FlatVector::IncrementalSelectionVector();
  RowDataCollection::Build
            ((vector<duckdb::BufferHandle,_true> *)local_a8,pRVar7,iVar3,key_locations,(idx_t *)0x0,
             pSVar8);
  blob_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_c8.
                super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  blob_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_c8.
                super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  blob_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_c8.
                super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_c8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_a8._16_8_;
  local_c8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
  local_c8.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a8._8_8_;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
            ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)&blob_chunk);
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
            ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)local_a8);
  DataChunk::ToUnifiedFormat(&blob_chunk);
  col_data = blob_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
  layout = this->payload_layout;
  pRVar13 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
            ::operator*(&this->payload_heap);
  RowOperations::Scatter
            ((DataChunk *)uVar5,(UnifiedVectorFormat *)col_data,layout,&this->addresses,pRVar13,
             this->sel_ptr,*(idx_t *)(uVar5 + 0x18));
  if (blob_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    ::std::default_delete<duckdb::UnifiedVectorFormat[]>::operator()
              ((default_delete<duckdb::UnifiedVectorFormat[]> *)&blob_chunk,
               (UnifiedVectorFormat *)
               blob_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_c8);
  return;
}

Assistant:

void LocalSortState::SinkChunk(DataChunk &sort, DataChunk &payload) {
	D_ASSERT(sort.size() == payload.size());
	// Build and serialize sorting data to radix sortable rows
	auto data_pointers = FlatVector::GetData<data_ptr_t>(addresses);
	auto handles = radix_sorting_data->Build(sort.size(), data_pointers, nullptr);
	for (idx_t sort_col = 0; sort_col < sort.ColumnCount(); sort_col++) {
		bool has_null = sort_layout->has_null[sort_col];
		bool nulls_first = sort_layout->order_by_null_types[sort_col] == OrderByNullType::NULLS_FIRST;
		bool desc = sort_layout->order_types[sort_col] == OrderType::DESCENDING;
		RowOperations::RadixScatter(sort.data[sort_col], sort.size(), sel_ptr, sort.size(), data_pointers, desc,
		                            has_null, nulls_first, sort_layout->prefix_lengths[sort_col],
		                            sort_layout->column_sizes[sort_col]);
	}

	// Also fully serialize blob sorting columns (to be able to break ties
	if (!sort_layout->all_constant) {
		DataChunk blob_chunk;
		blob_chunk.SetCardinality(sort.size());
		for (idx_t sort_col = 0; sort_col < sort.ColumnCount(); sort_col++) {
			if (!sort_layout->constant_size[sort_col]) {
				blob_chunk.data.emplace_back(sort.data[sort_col]);
			}
		}
		handles = blob_sorting_data->Build(blob_chunk.size(), data_pointers, nullptr);
		auto blob_data = blob_chunk.ToUnifiedFormat();
		RowOperations::Scatter(blob_chunk, blob_data.get(), sort_layout->blob_layout, addresses, *blob_sorting_heap,
		                       sel_ptr, blob_chunk.size());
		D_ASSERT(blob_sorting_heap->keep_pinned);
	}

	// Finally, serialize payload data
	handles = payload_data->Build(payload.size(), data_pointers, nullptr);
	auto input_data = payload.ToUnifiedFormat();
	RowOperations::Scatter(payload, input_data.get(), *payload_layout, addresses, *payload_heap, sel_ptr,
	                       payload.size());
	D_ASSERT(payload_heap->keep_pinned);
}